

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

ssize_t __thiscall Parser::write(Parser *this,int __fd,void *__buf,size_t __n)

{
  Function *pFVar1;
  QTextStream *pQVar2;
  QString *prefix;
  QString *pQVar3;
  Point *string;
  undefined4 in_register_00000034;
  long lVar4;
  Point *pPVar5;
  Function *func;
  Function *string_00;
  long in_FS_OFFSET;
  QList<Function> *__range1;
  QTextStream out;
  QString local_58;
  QTextStream local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40.d_ptr._M_t.
  super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>._M_t.
  super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>.
  super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl =
       (unique_ptr<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QTextStream::QTextStream(&local_40,(QIODevice *)CONCAT44(in_register_00000034,__fd));
  if ((this->m_prefixes).d.size != 0) {
    local_58.d.d = (Data *)0x0;
    local_58.d.ptr = L"{\n";
    local_58.d.size = 2;
    QTextStream::operator<<(&local_40,&local_58);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
    lVar4 = (this->m_prefixes).d.size;
    if (lVar4 != 0) {
      pQVar3 = (this->m_prefixes).d.ptr;
      lVar4 = lVar4 * 0x18;
      do {
        pQVar2 = QTextStream::operator<<(&local_40,pQVar3);
        QTextStream::operator<<(pQVar2,"\n");
        pQVar3 = pQVar3 + 1;
        lVar4 = lVar4 + -0x18;
      } while (lVar4 != 0);
    }
    local_58.d.d = (Data *)0x0;
    local_58.d.ptr = L"}\n";
    local_58.d.size = 2;
    QTextStream::operator<<(&local_40,&local_58);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  lVar4 = (this->m_metadata).d.size;
  if (lVar4 != 0) {
    pQVar3 = (this->m_metadata).d.ptr;
    lVar4 = lVar4 * 0x18;
    do {
      pQVar2 = QTextStream::operator<<(&local_40,pQVar3);
      QTextStream::operator<<(pQVar2,"\n");
      pQVar3 = pQVar3 + 1;
      lVar4 = lVar4 + -0x18;
    } while (lVar4 != 0);
  }
  lVar4 = (this->m_functions).d.size;
  if (lVar4 != 0) {
    string_00 = (this->m_functions).d.ptr;
    pFVar1 = string_00 + lVar4;
    do {
      pQVar2 = QTextStream::operator<<(&local_40,&string_00->className);
      pQVar2 = QTextStream::operator<<(pQVar2,"_");
      pQVar2 = QTextStream::operator<<(pQVar2,&string_00->functionName);
      pQVar2 = QTextStream::operator<<(pQVar2,"_entry(");
      pQVar2 = QTextStream::operator<<(pQVar2,&string_00->functionParameters);
      QTextStream::operator<<(pQVar2,")\n");
      pQVar2 = QTextStream::operator<<(&local_40,&string_00->className);
      pQVar2 = QTextStream::operator<<(pQVar2,"_");
      pQVar2 = QTextStream::operator<<(pQVar2,&string_00->functionName);
      QTextStream::operator<<(pQVar2,"_exit()\n");
      string_00 = string_00 + 1;
    } while (string_00 != pFVar1);
  }
  lVar4 = (this->m_points).d.size;
  if (lVar4 != 0) {
    string = (this->m_points).d.ptr;
    pPVar5 = string + lVar4;
    do {
      pQVar2 = QTextStream::operator<<(&local_40,&string->name);
      pQVar2 = QTextStream::operator<<(pQVar2,"(");
      pQVar2 = QTextStream::operator<<(pQVar2,&string->parameters);
      QTextStream::operator<<(pQVar2,")\n");
      string = string + 1;
    } while (string != pPVar5);
  }
  QTextStream::~QTextStream(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void Parser::write(QIODevice &input) const
{
    QTextStream out(&input);
    if (m_prefixes.size() > 0) {
        out << QStringLiteral("{\n");
        for (const auto &prefix : m_prefixes)
            out << prefix << "\n";
        out << QStringLiteral("}\n");
    }
    for (const auto &m : m_metadata)
        out << m << "\n";
    for (const auto &func : m_functions) {
        out << func.className << "_" << func.functionName << "_entry(" << func.functionParameters << ")\n";
        out << func.className << "_" << func.functionName << "_exit()\n";
    }
    for (const auto &point : m_points)
        out << point.name << "(" << point.parameters << ")\n";
}